

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNErrCode
SUNAdaptController_EstimateStep_Soderlind
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  sunrealtype sVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pdVar7 = (double *)C->content;
  dVar13 = (double)(p + 1);
  dVar11 = dsm * pdVar7[5];
  if (dVar11 <= 1e-10) {
    dVar11 = 1e-10;
  }
  iVar6 = *(int *)(pdVar7 + 10);
  if (iVar6 < 1) {
    dVar11 = (double)SUNRpowerR(dVar11,-*pdVar7 / dVar13);
    sVar10 = dVar11 * h;
  }
  else {
    dVar9 = pdVar7[2];
    dVar1 = pdVar7[3];
    dVar2 = pdVar7[4];
    dVar3 = pdVar7[8];
    dVar14 = h / dVar3;
    dVar4 = pdVar7[9];
    dVar8 = pdVar7[7];
    dVar12 = pdVar7[6];
    if (dVar12 <= 1e-10) {
      dVar12 = 1e-10;
    }
    dVar5 = pdVar7[1];
    dVar11 = (double)SUNRpowerR(dVar11,-*pdVar7 / dVar13);
    dVar12 = (double)SUNRpowerR(dVar12,-dVar5 / dVar13);
    dVar12 = dVar11 * h * dVar12;
    if (iVar6 == 1) {
      dVar11 = (double)SUNRpowerR(dVar14,dVar1);
      sVar10 = dVar12 * dVar11;
    }
    else {
      if (dVar8 <= 1e-10) {
        dVar8 = 1e-10;
      }
      dVar11 = (double)SUNRpowerR(dVar8,-dVar9 / dVar13);
      dVar13 = (double)SUNRpowerR(dVar14,dVar1);
      dVar9 = (double)SUNRpowerR(dVar3 / dVar4,dVar2);
      sVar10 = dVar9 * dVar13 * dVar12 * dVar11;
    }
  }
  *hnew = sVar10;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_Soderlind(SUNAdaptController C,
                                                     sunrealtype h, int p,
                                                     sunrealtype dsm,
                                                     sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);

  /* order parameter to use */
  const int ord = p + 1;

  /* set usable time-step adaptivity parameters */
  const sunrealtype k1    = -SODERLIND_K1(C) / ord;
  const sunrealtype k2    = -SODERLIND_K2(C) / ord;
  const sunrealtype k3    = -SODERLIND_K3(C) / ord;
  const sunrealtype k4    = SODERLIND_K4(C);
  const sunrealtype k5    = SODERLIND_K5(C);
  const sunrealtype e1    = SUNMAX(SODERLIND_BIAS(C) * dsm, TINY);
  const sunrealtype e2    = SUNMAX(SODERLIND_EP(C), TINY);
  const sunrealtype e3    = SUNMAX(SODERLIND_EPP(C), TINY);
  const sunrealtype hrat  = h / SODERLIND_HP(C);
  const sunrealtype hrat2 = SODERLIND_HP(C) / SODERLIND_HPP(C);

  /* compute estimated optimal time step size */
  if (SODERLIND_FIRSTSTEPS(C) < 1) { *hnew = h * SUNRpowerR(e1, k1); }
  else if (SODERLIND_FIRSTSTEPS(C) < 2)
  {
    *hnew = h * SUNRpowerR(e1, k1) * SUNRpowerR(e2, k2) * SUNRpowerR(hrat, k4);
  }
  else
  {
    *hnew = h * SUNRpowerR(e1, k1) * SUNRpowerR(e2, k2) * SUNRpowerR(e3, k3) *
            SUNRpowerR(hrat, k4) * SUNRpowerR(hrat2, k5);
  }

  /* return with success */
  return SUN_SUCCESS;
}